

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall
QRhiGles2::gatherSamplers
          (QRhiGles2 *this,GLuint program,InOutVariable *v,QGles2SamplerDescriptionVector *dst)

{
  char *pcVar1;
  long in_FS_OFFSET;
  undefined1 local_38 [8];
  undefined1 *puStack_30;
  QGles2SamplerDescription local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_4_ = -0x55555556;
  local_38._4_4_ = -0x55555556;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  pcVar1 = (v->name).d.ptr;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)&QByteArray::_empty;
  }
  local_38._0_4_ =
       (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
         [0x5e])(program,pcVar1);
  if (-1 < (int)local_38._0_4_) {
    local_38._4_4_ = v->binding;
    puStack_30 = (undefined1 *)0xffffffffffffffff;
    if ((dst->super_QVLABase<QGles2SamplerDescription>).super_QVLABaseBase.s ==
        (dst->super_QVLABase<QGles2SamplerDescription>).super_QVLABaseBase.a) {
      local_28.tbinding = -1;
      local_28.sbinding = -1;
      local_28.glslLocation = local_38._0_4_;
      local_28.combinedBinding = local_38._4_4_;
      QVLABase<QGles2SamplerDescription>::emplace_back_impl<QGles2SamplerDescription>
                (&dst->super_QVLABase<QGles2SamplerDescription>,4,
                 &dst->super_QVLAStorage<16UL,_4UL,_4LL>,&local_28);
    }
    else {
      QVLABase<QGles2SamplerDescription>::emplace_back_impl<QGles2SamplerDescription_const&>
                (&dst->super_QVLABase<QGles2SamplerDescription>,4,
                 &dst->super_QVLAStorage<16UL,_4UL,_4LL>,(QGles2SamplerDescription *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiGles2::gatherSamplers(GLuint program,
                               const QShaderDescription::InOutVariable &v,
                               QGles2SamplerDescriptionVector *dst)
{
    QGles2SamplerDescription sampler;
    sampler.glslLocation = f->glGetUniformLocation(program, v.name.constData());
    if (sampler.glslLocation >= 0) {
        sampler.combinedBinding = v.binding;
        sampler.tbinding = -1;
        sampler.sbinding = -1;
        dst->append(sampler);
    }
}